

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioutils.cpp
# Opt level: O0

bool QMakeInternal::IoUtils::readLinkTarget(QString *symlinkPath,QString *target)

{
  bool bVar1;
  int iVar2;
  char *__path;
  ssize_t sVar3;
  long in_FS_OFFSET;
  int len;
  QByteArray localSymlinkPath;
  char s [4097];
  undefined7 in_stack_ffffffffffffef78;
  undefined1 in_stack_ffffffffffffef7f;
  undefined4 in_stack_ffffffffffffef80;
  QByteArray local_1060 [2];
  undefined8 local_1030;
  undefined8 local_1028;
  undefined8 local_1020;
  char local_1018 [4112];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_1030 = 0xaaaaaaaaaaaaaaaa;
  local_1028 = 0xaaaaaaaaaaaaaaaa;
  local_1020 = 0xaaaaaaaaaaaaaaaa;
  QFile::encodeName((QString *)CONCAT17(in_stack_ffffffffffffef7f,in_stack_ffffffffffffef78));
  memset(local_1018,0xaa,0x1001);
  __path = QByteArray::constData((QByteArray *)0x2c4267);
  sVar3 = readlink(__path,local_1018,0x1000);
  iVar2 = (int)sVar3;
  bVar1 = 0 < iVar2;
  if (bVar1) {
    QByteArray::QByteArray(local_1060,local_1018,(long)iVar2);
    QFile::decodeName((QByteArray *)CONCAT17(in_stack_ffffffffffffef7f,in_stack_ffffffffffffef78));
    QString::operator=((QString *)CONCAT44(iVar2,in_stack_ffffffffffffef80),
                       (QString *)CONCAT17(in_stack_ffffffffffffef7f,in_stack_ffffffffffffef78));
    QString::~QString((QString *)0x2c42cf);
    QByteArray::~QByteArray((QByteArray *)0x2c42d9);
  }
  QByteArray::~QByteArray((QByteArray *)0x2c42f0);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool IoUtils::readLinkTarget(const QString &symlinkPath, QString *target)
{
    const QByteArray localSymlinkPath = QFile::encodeName(symlinkPath);
#  if defined(__GLIBC__) && !defined(PATH_MAX)
#    define PATH_CHUNK_SIZE 256
    char *s = 0;
    int len = -1;
    int size = PATH_CHUNK_SIZE;

    forever {
        s = (char *)::realloc(s, size);
        len = ::readlink(localSymlinkPath.constData(), s, size);
        if (len < 0) {
            ::free(s);
            break;
        }
        if (len < size)
            break;
        size *= 2;
    }
#  else
    char s[PATH_MAX+1];
    int len = readlink(localSymlinkPath.constData(), s, PATH_MAX);
#  endif
    if (len <= 0)
        return false;
    *target = QFile::decodeName(QByteArray(s, len));
#  if defined(__GLIBC__) && !defined(PATH_MAX)
    ::free(s);
#  endif
    return true;
}